

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

void UA_SecureChannel_removeChunk(UA_SecureChannel *channel,UA_UInt32 requestId)

{
  ChunkEntry *pCVar1;
  ChunkEntry **ppCVar2;
  ChunkEntry *__ptr;
  
  __ptr = (ChunkEntry *)&channel->chunks;
  do {
    __ptr = (__ptr->pointers).le_next;
    if (__ptr == (ChunkEntry *)0x0) {
      return;
    }
  } while (__ptr->requestId != requestId);
  UA_ByteString_deleteMembers(&__ptr->bytes);
  pCVar1 = (__ptr->pointers).le_next;
  ppCVar2 = (__ptr->pointers).le_prev;
  if (pCVar1 != (ChunkEntry *)0x0) {
    (pCVar1->pointers).le_prev = ppCVar2;
  }
  *ppCVar2 = pCVar1;
  free(__ptr);
  return;
}

Assistant:

static void
UA_SecureChannel_removeChunk(UA_SecureChannel *channel, UA_UInt32 requestId) {
    struct ChunkEntry *ch;
    LIST_FOREACH(ch, &channel->chunks, pointers) {
        if(ch->requestId == requestId) {
            UA_ByteString_deleteMembers(&ch->bytes);
            LIST_REMOVE(ch, pointers);
            UA_free(ch);
            return;
        }
    }
}